

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void p_b_cclass(parse *p,cset *cs)

{
  char cVar1;
  char *__s2;
  int iVar2;
  ushort **ppuVar3;
  size_t sVar4;
  bool bVar5;
  char *pcStack_38;
  char c;
  char *u;
  size_t len;
  cclass *cp;
  char *sp;
  cset *cs_local;
  parse *p_local;
  
  __s2 = p->next;
  while( true ) {
    bVar5 = false;
    if (p->next < p->end) {
      ppuVar3 = __ctype_b_loc();
      bVar5 = ((*ppuVar3)[(int)*p->next] & 0x400) != 0;
    }
    if (!bVar5) break;
    p->next = p->next + 1;
  }
  sVar4 = (long)p->next - (long)__s2;
  for (len = (size_t)cclasses;
      (*(long *)len != 0 &&
      ((iVar2 = strncmp(*(char **)len,__s2,sVar4), iVar2 != 0 ||
       (*(char *)(*(long *)len + sVar4) != '\0')))); len = len + 0x18) {
  }
  if (*(long *)len == 0) {
    seterr(p,4);
  }
  else {
    pcStack_38 = *(char **)(len + 8);
    while( true ) {
      cVar1 = *pcStack_38;
      if (cVar1 == '\0') break;
      cs->ptr[(int)cVar1] = cs->ptr[(int)cVar1] | cs->mask;
      cs->hash = cs->hash + cVar1;
      pcStack_38 = pcStack_38 + 1;
    }
    for (pcStack_38 = *(char **)(len + 0x10); *pcStack_38 != '\0';
        pcStack_38 = pcStack_38 + sVar4 + 1) {
      mcadd(p,cs,pcStack_38);
      sVar4 = strlen(pcStack_38);
    }
  }
  return;
}

Assistant:

static void
p_b_cclass(p, cs)
struct parse *p;
cset *cs;
{
	char *sp = p->next;
	struct cclass *cp;
	size_t len;
	char *u;
	char c;

	while (MORE() && isalpha(PEEK()))
		NEXT();
	len = (size_t)(p->next - sp);
	for (cp = cclasses; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			break;
	if (cp->name == NULL) {
		/* oops, didn't find it */
		seterr(p, REG_ECTYPE);
		return;
	}

	u = cp->chars;
	while ((c = *u++) != '\0')
		CHadd(cs, c);
	for (u = cp->multis; *u != '\0'; u += strlen(u) + 1)
		MCadd(p, cs, u);
}